

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * path<std::__cxx11::string,char_const*>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pathList,
                   char *pathList_1)

{
  char *pcVar1;
  allocator local_61;
  char *local_60;
  long local_58;
  char local_50 [16];
  undefined2 *local_40;
  undefined8 local_38;
  undefined2 local_30 [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(pathList->_M_dataplus)._M_p);
  std::__cxx11::string::string((string *)&local_60,pathList_1,&local_61);
  if (((__return_storage_ptr__->_M_string_length == 0) ||
      ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
       '\\')) || ((local_58 != 0 && (*local_60 == '\\')))) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  }
  else {
    local_30[0] = 0x2f;
    local_38 = 1;
    local_40 = local_30;
    pcVar1 = (char *)std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_30)
    ;
    std::__cxx11::string::_M_append(pcVar1,(ulong)local_60);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string path(T... pathList) {
    std::string path;
    auto append = [&path](const std::string &s) {
        if ((path.empty() || path.back() == '\\') || (!s.empty() && s.front() == '\\')) {
            path.append(s);
        } else {
            path.append(pathSeparator()).append(s);
        }
    };
    std::initializer_list<int>{(append(pathList), 0)...};
    return path;
}